

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O1

int cfft2i_(int *l,int *m,double *wsave,int *lensav,int *ier)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  int i__1;
  int ier1;
  int local_40;
  int local_3c;
  double *local_38;
  
  *ier = 0;
  iVar1 = *lensav;
  iVar2 = *l;
  local_38 = wsave;
  dVar6 = log((double)iVar2);
  iVar3 = *m;
  dVar7 = log((double)iVar3);
  iVar5 = 2;
  if ((int)(dVar7 / 0.6931471805599453) + (int)(dVar6 / 0.6931471805599453) + (iVar2 + iVar3) * 2 +
      8 <= iVar1) {
    iVar1 = *l;
    dVar6 = log((double)iVar1);
    local_40 = (int)(dVar6 / 0.6931471805599453) + iVar1 * 2 + 4;
    cfftmi_(l,local_38,&local_40,&local_3c);
    pdVar4 = local_38;
    iVar5 = 0x14;
    if (local_3c == 0) {
      iVar1 = *m;
      dVar6 = log((double)iVar1);
      local_40 = (int)(dVar6 / 0.6931471805599453) + iVar1 * 2 + 4;
      iVar1 = *l;
      dVar6 = log((double)iVar1);
      cfftmi_(m,pdVar4 + (long)((int)(dVar6 / 0.6931471805599453) + iVar1 * 2) + 2,&local_40,
              &local_3c);
      if (local_3c == 0) {
        return 0;
      }
    }
  }
  *ier = iVar5;
  return 0;
}

Assistant:

int cfft2i_(int *l, int *m, fft_real_t *wsave, int *
	lensav, int *ier)
{
    /* System generated locals */
    int i__1;

    /* Builtin functions */


    /* Local variables */
     int ier1;
    extern /* Subroutine */ int cfftmi_(int *, fft_real_t *, int *, int
	    *), xerfft_(char *, int *, ftnlen);


/* Initialize error return */

    /* Parameter adjustments */
    --wsave;

    /* Function Body */
    *ier = 0;

    if (*lensav < (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + (*m <<
	     1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 8) {
	*ier = 2;
	//xerfft_("CFFT2I", &c__4, (ftnlen)6);
	goto L100;
    }

    i__1 = (*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 4;
    cfftmi_(l, &wsave[1], &i__1, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("CFFT2I", &c_n5, (ftnlen)6);
	goto L100;
    }
    i__1 = (*m << 1) + (int) (log((fft_real_t) (*m)) / log(2.0)) + 4;
    cfftmi_(m, &wsave[(*l << 1) + (int) (log((fft_real_t) (*l)) / log(2.0)) + 3]
	    , &i__1, &ier1);
    if (ier1 != 0) {
	*ier = 20;
	//xerfft_("CFFT2I", &c_n5, (ftnlen)6);
    }

L100:
    return 0;
}